

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::Renderer::Renderer
          (Renderer *this,Context *context,
          unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
          *graphicsSystem,string *assetsPath)

{
  pointer pcVar1;
  GraphicsSystem *pGVar2;
  uint local_5c;
  long *local_58 [2];
  long local_48 [2];
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__Renderer_00115830;
  this->context = context;
  (this->graphicsSystem)._M_t.
  super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>._M_head_impl =
       (graphicsSystem->_M_t).
       super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
       ._M_t.
       super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
       .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>._M_head_impl
  ;
  (graphicsSystem->_M_t).
  super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
  .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>._M_head_impl =
       (GraphicsSystem *)0x0;
  (this->assetsPath)._M_dataplus._M_p = (pointer)&(this->assetsPath).field_2;
  pcVar1 = (assetsPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->assetsPath,pcVar1,pcVar1 + assetsPath->_M_string_length);
  this->backgroundId = 0;
  this->cardsId = 0;
  this->cardPlaceholderId = 0;
  this->winId = 0;
  this->newGameId = 0;
  this->undoId = 0;
  pGVar2 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  (*pGVar2->_vptr_GraphicsSystem[2])
            (pGVar2,(anonymous_namespace)::windowTitle_abi_cxx11_,0x280,0x1e0);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"background.bmp","");
  loadTexture((Renderer *)&local_5c,(string *)this);
  (this->backgroundId).t = local_5c;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"cards.bmp","");
  loadTexture((Renderer *)&local_5c,(string *)this);
  (this->cardsId).t = local_5c;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"card_placeholder.bmp","");
  loadTexture((Renderer *)&local_5c,(string *)this);
  (this->cardPlaceholderId).t = local_5c;
  local_2c = local_5c;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
    local_2c = (this->cardPlaceholderId).t;
  }
  pGVar2 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  (*pGVar2->_vptr_GraphicsSystem[4])(pGVar2,&local_2c,0x46);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"win.bmp","");
  loadTexture((Renderer *)&local_5c,(string *)this);
  (this->winId).t = local_5c;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"new_game.bmp","");
  loadTexture((Renderer *)&local_5c,(string *)this);
  (this->newGameId).t = local_5c;
  local_30 = local_5c;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
    local_30 = (this->newGameId).t;
  }
  pGVar2 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  (*pGVar2->_vptr_GraphicsSystem[4])(pGVar2,&local_30,0x96);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"undo.bmp","");
  loadTexture((Renderer *)&local_5c,(string *)this);
  (this->undoId).t = local_5c;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
    local_5c = (this->undoId).t;
  }
  pGVar2 = (this->graphicsSystem)._M_t.
           super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
           _M_head_impl;
  local_34 = local_5c;
  (*pGVar2->_vptr_GraphicsSystem[4])(pGVar2,&local_34,0x96);
  return;
}

Assistant:

Renderer::Renderer(const Context& context,
                   std::unique_ptr<GraphicsSystem> graphicsSystem,
                   const std::string& assetsPath):
    context {context},
    graphicsSystem {std::move(graphicsSystem)},
    assetsPath {assetsPath}
{
    this->graphicsSystem->createWindow(windowTitle, windowWidth, windowHeight);
    backgroundId = loadTexture("background.bmp");
    cardsId = loadTexture("cards.bmp");
    cardPlaceholderId = loadTexture("card_placeholder.bmp");
    this->graphicsSystem->setTextureAlpha(cardPlaceholderId, cardPlaceholderAlpha);
    winId = loadTexture("win.bmp");
    newGameId = loadTexture("new_game.bmp");
    this->graphicsSystem->setTextureAlpha(newGameId, buttonAlpha);
    undoId = loadTexture("undo.bmp");
    this->graphicsSystem->setTextureAlpha(undoId, buttonAlpha);
}